

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

void __thiscall
CCheckQueue<FakeCheck>::CCheckQueue
          (CCheckQueue<FakeCheckCheckCompletion> *this,uint batch_size,int worker_threads_num)

{
  long lVar1;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  type *__args;
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  size_type __n;
  long in_FS_OFFSET;
  int n;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff88);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x28));
  __args = (type *)(in_RDI + 0x58);
  std::condition_variable::condition_variable((condition_variable *)__args);
  this_00 = (vector<std::thread,_std::allocator<std::thread>_> *)(in_RDI + 0x88);
  std::vector<FakeCheck,_std::allocator<FakeCheck>_>::vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_ffffffffffffff88);
  *(undefined4 *)(in_RDI + 0xa0) = 0;
  *(undefined4 *)(in_RDI + 0xa4) = 0;
  *(undefined1 *)(in_RDI + 0xa8) = 1;
  *(undefined4 *)(in_RDI + 0xac) = 0;
  *(undefined4 *)(in_RDI + 0xb0) = in_ESI;
  __n = in_RDI + 0xb8;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0xd0) = 0;
  AnnotatedMixin<std::mutex>::AnnotatedMixin(in_stack_ffffffffffffff88);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),__n);
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<CCheckQueue<FakeCheck>::CCheckQueue(unsigned_int,int)::_lambda()_1_>
              (this_00,__args);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueue(unsigned int batch_size, int worker_threads_num)
        : nBatchSize(batch_size)
    {
        m_worker_threads.reserve(worker_threads_num);
        for (int n = 0; n < worker_threads_num; ++n) {
            m_worker_threads.emplace_back([this, n]() {
                util::ThreadRename(strprintf("scriptch.%i", n));
                Loop(false /* worker thread */);
            });
        }
    }